

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O2

void nstime_prof_update_impl(nstime_t *time)

{
  timespec ts;
  timespec local_20;
  
  if (duckdb_je_opt_prof_time_res == prof_time_res_high) {
    clock_gettime(0,&local_20);
    time->ns = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
    return;
  }
  nstime_get(time);
  return;
}

Assistant:

static void
nstime_prof_update_impl(nstime_t *time) {
	nstime_t old_time;

	nstime_copy(&old_time, time);

	if (opt_prof_time_res == prof_time_res_high) {
		nstime_get_realtime(time);
	} else {
		nstime_get(time);
	}
}